

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void recomputeColumnsNotIndexed(Index *pIdx)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  if ((ulong)pIdx->nColumn == 0) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    uVar1 = (ulong)pIdx->nColumn + 1;
    uVar2 = 0;
    do {
      uVar3 = (ulong)pIdx->aiColumn[uVar1 - 2];
      if (((-1 < (long)uVar3) && ((ushort)pIdx->aiColumn[uVar1 - 2] < 0x3f)) &&
         ((pIdx->pTable->aCol[uVar3].colFlags & 0x20) == 0)) {
        uVar2 = uVar2 | 1L << (uVar3 & 0x3f);
      }
      uVar1 = uVar1 - 1;
    } while (1 < uVar1);
    uVar2 = ~uVar2;
  }
  pIdx->colNotIdxed = uVar2;
  return;
}

Assistant:

static void recomputeColumnsNotIndexed(Index *pIdx){
  Bitmask m = 0;
  int j;
  Table *pTab = pIdx->pTable;
  for(j=pIdx->nColumn-1; j>=0; j--){
    int x = pIdx->aiColumn[j];
    if( x>=0 && (pTab->aCol[x].colFlags & COLFLAG_VIRTUAL)==0 ){
      testcase( x==BMS-1 );
      testcase( x==BMS-2 );
      if( x<BMS-1 ) m |= MASKBIT(x);
    }
  }
  pIdx->colNotIdxed = ~m;
  assert( (pIdx->colNotIdxed>>63)==1 );  /* See note-20221022-a */
}